

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siamese.cpp
# Opt level: O0

int siamese_init_(int version)

{
  int iVar1;
  int in_EDI;
  undefined4 local_4;
  
  if (in_EDI == 5) {
    iVar1 = gf256_init_(0x230dce);
    if (iVar1 == 0) {
      m_Initialized = true;
      local_4 = 0;
    }
    else {
      local_4 = 5;
    }
  }
  else {
    local_4 = 5;
  }
  return local_4;
}

Assistant:

SIAMESE_EXPORT int siamese_init_(int version)
{
    if (version != SIAMESE_VERSION)
        return Siamese_Disabled;

    if (0 != gf256_init())
        return Siamese_Disabled;

    m_Initialized = true;
    return Siamese_Success;
}